

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::InstancedRenderingCase::iterate(InstancedRenderingCase *this)

{
  int iVar1;
  int iVar2;
  RenderContext *context;
  bool bVar3;
  deUint32 dVar4;
  RenderTarget *pRVar5;
  char *description;
  int width;
  uint y;
  uint x;
  int height;
  Surface resultImg;
  Surface referenceImg;
  Random rnd;
  Surface local_a0;
  TextureFormat local_88;
  Surface local_80;
  deRandom local_68;
  PixelBufferAccess local_58;
  
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar5->m_width;
  if (0x7f < width) {
    width = 0x80;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x80;
  if (pRVar5->m_height < 0x80) {
    height = pRVar5->m_height;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar5->m_width;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar5->m_height;
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_68,dVar4);
  dVar4 = deRandom_getUint32(&local_68);
  x = dVar4 % ((iVar1 - width) + 1U);
  dVar4 = deRandom_getUint32(&local_68);
  y = dVar4 % ((iVar2 - height) + 1U);
  tcu::Surface::Surface(&local_80,width,height);
  tcu::Surface::Surface(&local_a0,width,height);
  glwViewport(x,y,width,height);
  setupAndRender(this);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  if ((void *)local_a0.m_pixels.m_cap != (void *)0x0) {
    local_a0.m_pixels.m_cap = (size_t)local_a0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_88,local_a0.m_width,local_a0.m_height,1,
             (void *)local_a0.m_pixels.m_cap);
  glu::readPixels(context,x,y,&local_58);
  computeReference(this,&local_80);
  bVar3 = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            "ComparisonResult","Image comparison result",&local_80,&local_a0,0.05,
                            COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar3) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar3,description
            );
  tcu::Surface::~Surface(&local_a0);
  tcu::Surface::~Surface(&local_80);
  return STOP;
}

Assistant:

InstancedRenderingCase::IterateResult InstancedRenderingCase::iterate (void)
{
	int							width			= deMin32(m_context.getRenderTarget().getWidth(), MAX_RENDER_WIDTH);
	int							height			= deMin32(m_context.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT);

	int							xOffsetMax		= m_context.getRenderTarget().getWidth() - width;
	int							yOffsetMax		= m_context.getRenderTarget().getHeight() - height;

	de::Random					rnd				(deStringHash(getName()));

	int							xOffset			= rnd.getInt(0, xOffsetMax);
	int							yOffset			= rnd.getInt(0, yOffsetMax);
	tcu::Surface				referenceImg	(width, height);
	tcu::Surface				resultImg		(width, height);

	// Draw result.

	glViewport(xOffset, yOffset, width, height);

	setupAndRender();

	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, resultImg.getAccess());

	// Compute reference.

	computeReference(referenceImg);

	// Compare.

	bool testOk = tcu::fuzzyCompare(m_testCtx.getLog(), "ComparisonResult", "Image comparison result", referenceImg, resultImg, 0.05f, tcu::COMPARE_LOG_RESULT);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							testOk ? "Pass"					: "Fail");

	return STOP;
}